

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_task.hpp
# Opt level: O0

void __thiscall tf::AsyncTask::_decref(AsyncTask *this)

{
  __int_type_conflict1 _Var1;
  void *pvVar2;
  add_pointer_t<tf::Node::DependentAsync> ptVar3;
  atomic<unsigned_long> *this_00;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    ptVar3 = std::
             get_if<tf::Node::DependentAsync,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                       ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                         *)0x1ce781);
    this_00 = &ptVar3->use_count;
    LOCK();
    _Var1 = (this_00->super___atomic_base<unsigned_long>)._M_i;
    (this_00->super___atomic_base<unsigned_long>)._M_i =
         (this_00->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if ((_Var1 == 1) && (pvVar2 = (void *)*in_RDI, pvVar2 != (void *)0x0)) {
      Node::~Node((Node *)this_00);
      operator_delete(pvVar2,0xd8);
    }
  }
  return;
}

Assistant:

inline void AsyncTask::_decref() {
  if(_node && std::get_if<Node::DependentAsync>(&(_node->_handle))->use_count.fetch_sub(
      1, std::memory_order_acq_rel
    ) == 1) {
    recycle(_node);
  }
}